

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O3

int SSL_set_signed_cert_timestamp_list(SSL *ssl,uint8_t *list,size_t list_len)

{
  int iVar1;
  uint uVar2;
  UniquePtr<CRYPTO_BUFFER> buf;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_18;
  
  if ((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl == (SSL_CONFIG *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    local_18._M_head_impl = CRYPTO_BUFFER_new(list,list_len,(CRYPTO_BUFFER_POOL *)0x0);
    if (local_18._M_head_impl != (CRYPTO_BUFFER *)0x0) {
      iVar1 = SSL_CREDENTIAL_set1_signed_cert_timestamp_list
                        (*(SSL_CREDENTIAL **)
                          ((long)(((ssl->config)._M_t.
                                   super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->
                                 cert)._M_t.
                                 super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter> + 0x18),
                         local_18._M_head_impl);
      uVar2 = (uint)(iVar1 != 0);
    }
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_18);
  }
  return uVar2;
}

Assistant:

int SSL_set_signed_cert_timestamp_list(SSL *ssl, const uint8_t *list,
                                       size_t list_len) {
  if (!ssl->config) {
    return 0;
  }
  UniquePtr<CRYPTO_BUFFER> buf(CRYPTO_BUFFER_new(list, list_len, nullptr));
  return buf != nullptr &&
         SSL_CREDENTIAL_set1_signed_cert_timestamp_list(
             ssl->config->cert->legacy_credential.get(), buf.get());
}